

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal_and_texture.c
# Opt level: O3

bool_t prf_vertex_with_normal_and_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  float64_t *pfVar1;
  ushort uVar2;
  uint uVar3;
  uint len;
  bool_t bVar4;
  
  if (node->opcode == prf_vertex_with_normal_and_texture_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    pfVar1 = (float64_t *)node->data;
    bf_put_uint16_be(bfile,*(uint16_t *)(pfVar1 + 3));
    bf_put_uint16_be(bfile,*(uint16_t *)((long)pfVar1 + 0x1a));
    bf_put_float64_be(bfile,*pfVar1);
    bf_put_float64_be(bfile,pfVar1[1]);
    bf_put_float64_be(bfile,pfVar1[2]);
    uVar2 = node->length;
    uVar3 = 0x20;
    if (0x23 < uVar2) {
      bf_put_float32_be(bfile,*(float32_t *)((long)pfVar1 + 0x1c));
      uVar2 = node->length;
      uVar3 = 0x24;
      if (0x27 < uVar2) {
        bf_put_float32_be(bfile,*(float32_t *)(pfVar1 + 4));
        uVar2 = node->length;
        uVar3 = 0x28;
        if (0x2b < uVar2) {
          bf_put_float32_be(bfile,*(float32_t *)((long)pfVar1 + 0x24));
          uVar2 = node->length;
          uVar3 = 0x2c;
          if (0x2f < uVar2) {
            bf_put_float32_be(bfile,*(float32_t *)(pfVar1 + 5));
            uVar2 = node->length;
            uVar3 = 0x30;
            if (0x33 < uVar2) {
              bf_put_float32_be(bfile,*(float32_t *)((long)pfVar1 + 0x2c));
              uVar2 = node->length;
              uVar3 = 0x34;
              if (0x37 < uVar2) {
                bf_put_uint32_be(bfile,*(uint32_t *)(pfVar1 + 6));
                uVar2 = node->length;
                uVar3 = 0x38;
                if (0x3b < uVar2) {
                  bf_put_uint32_be(bfile,*(uint32_t *)((long)pfVar1 + 0x34));
                  uVar2 = node->length;
                  uVar3 = 0x3c;
                }
              }
            }
          }
        }
      }
    }
    bVar4 = 1;
    len = uVar2 - uVar3;
    if (uVar3 <= uVar2 && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar3 - 4),len);
    }
  }
  else {
    bVar4 = 0;
    prf_error(9,"tried vertex with normal and texture save method on node of type %d.");
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_vertex_with_normal_and_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_vertex_with_normal_and_texture_info.opcode ) {
        prf_error( 9,
        "tried vertex with normal and texture save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        assert( data != NULL );
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->flags ); pos += 2;
        bf_put_float64_be( bfile, prf_dblread( data->x ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->y ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->z ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->color_index ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}